

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_b0093a::TGlslangToSpvTraverser::visitBranch
          (TGlslangToSpvTraverser *this,TVisit param_1,TIntermBranch *node)

{
  int iVar1;
  int iVar2;
  TOperator TVar3;
  EShSource EVar4;
  Id IVar5;
  Id IVar6;
  Decoration DVar7;
  Decoration DVar8;
  TIntermTyped *pTVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *filename;
  SpvVersion *pSVar10;
  reference pvVar11;
  TType *type;
  Id local_2c;
  Id copyId;
  Id returnId;
  TType *glslangReturnType;
  TIntermBranch *node_local;
  TVisit param_1_local;
  TGlslangToSpvTraverser *this_local;
  undefined4 extraout_var_01;
  
  pTVar9 = glslang::TIntermBranch::getExpression(node);
  if (pTVar9 != (TIntermTyped *)0x0) {
    pTVar9 = glslang::TIntermBranch::getExpression(node);
    (*(pTVar9->super_TIntermNode)._vptr_TIntermNode[2])(pTVar9,this);
  }
  iVar1 = (**(node->super_TIntermNode)._vptr_TIntermNode)();
  iVar1 = *(int *)(CONCAT44(extraout_var,iVar1) + 0xc);
  iVar2 = (**(node->super_TIntermNode)._vptr_TIntermNode)();
  filename = glslang::TSourceLoc::getFilename((TSourceLoc *)CONCAT44(extraout_var_00,iVar2));
  spv::Builder::setDebugSourceLocation(&this->builder,iVar1,filename);
  TVar3 = glslang::TIntermBranch::getFlowOp(node);
  switch(TVar3) {
  case EOpKill:
    pSVar10 = glslang::TIntermediate::getSpv(this->glslangIntermediate);
    if (pSVar10->spv < 0x10600) {
      spv::Builder::makeStatementTerminator(&this->builder,OpKill,"post-discard");
    }
    else {
      EVar4 = glslang::TIntermediate::getSource(this->glslangIntermediate);
      if (EVar4 == EShSourceHlsl) {
        spv::Builder::addCapability(&this->builder,CapabilityDemoteToHelperInvocation);
        spv::Builder::createNoResultOp(&this->builder,OpDemoteToHelperInvocation);
      }
      else {
        spv::Builder::makeStatementTerminator
                  (&this->builder,OpTerminateInvocation,"post-terminate-invocation");
      }
    }
    break;
  case EOpTerminateInvocation:
    spv::Builder::addExtension(&this->builder,"SPV_KHR_terminate_invocation");
    spv::Builder::makeStatementTerminator
              (&this->builder,OpTerminateInvocation,"post-terminate-invocation");
    break;
  case EOpDemote:
    spv::Builder::createNoResultOp(&this->builder,OpDemoteToHelperInvocation);
    spv::Builder::addExtension(&this->builder,"SPV_EXT_demote_to_helper_invocation");
    spv::Builder::addCapability(&this->builder,CapabilityDemoteToHelperInvocation);
    break;
  case EOpTerminateRayKHR:
    spv::Builder::makeStatementTerminator(&this->builder,OpTerminateRayKHR,"post-terminateRayKHR");
    break;
  case EOpIgnoreIntersectionKHR:
    spv::Builder::makeStatementTerminator
              (&this->builder,OpIgnoreIntersectionKHR,"post-ignoreIntersectionKHR");
    break;
  case EOpReturn:
    pTVar9 = glslang::TIntermBranch::getExpression(node);
    if (pTVar9 == (TIntermTyped *)0x0) {
      spv::Builder::makeReturn(&this->builder,false,0);
    }
    else {
      pTVar9 = glslang::TIntermBranch::getExpression(node);
      iVar1 = (*(pTVar9->super_TIntermNode)._vptr_TIntermNode[0x1e])();
      type = (TType *)CONCAT44(extraout_var_01,iVar1);
      local_2c = accessChainLoad(this,type);
      IVar5 = spv::Builder::getTypeId(&this->builder,local_2c);
      IVar6 = spv::Function::getReturnType(this->currentFunction);
      if (IVar5 == IVar6) {
        DVar7 = TranslatePrecisionDecoration(type);
        DVar8 = spv::Function::getReturnPrecision(this->currentFunction);
        if (DVar7 != DVar8) goto LAB_0068ff1c;
      }
      else {
LAB_0068ff1c:
        spv::Builder::clearAccessChain(&this->builder);
        DVar7 = spv::Function::getReturnPrecision(this->currentFunction);
        IVar5 = spv::Function::getReturnType(this->currentFunction);
        IVar5 = spv::Builder::createVariable(&this->builder,DVar7,Function,IVar5,(char *)0x0,0,true)
        ;
        spv::Builder::setAccessChainLValue(&this->builder,IVar5);
        multiTypeStore(this,type,local_2c);
        DVar7 = spv::Function::getReturnPrecision(this->currentFunction);
        local_2c = spv::Builder::createLoad(&this->builder,IVar5,DVar7,MaskNone,Max,0);
      }
      spv::Builder::makeReturn(&this->builder,false,local_2c);
    }
    spv::Builder::clearAccessChain(&this->builder);
    break;
  case EOpBreak:
    pvVar11 = std::stack<bool,_std::deque<bool,_std::allocator<bool>_>_>::top(&this->breakForLoop);
    if ((*pvVar11 & 1U) == 0) {
      spv::Builder::addSwitchBreak(&this->builder,false);
    }
    else {
      spv::Builder::createLoopExit(&this->builder);
    }
    break;
  case EOpContinue:
    spv::Builder::createLoopContinue(&this->builder);
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                  ,0x1297,
                  "virtual bool (anonymous namespace)::TGlslangToSpvTraverser::visitBranch(glslang::TVisit, glslang::TIntermBranch *)"
                 );
  }
  return false;
}

Assistant:

bool TGlslangToSpvTraverser::visitBranch(glslang::TVisit /* visit */, glslang::TIntermBranch* node)
{
    if (node->getExpression())
        node->getExpression()->traverse(this);

    builder.setDebugSourceLocation(node->getLoc().line, node->getLoc().getFilename());

    switch (node->getFlowOp()) {
    case glslang::EOpKill:
        if (glslangIntermediate->getSpv().spv >= glslang::EShTargetSpv_1_6) {
            if (glslangIntermediate->getSource() == glslang::EShSourceHlsl) {
              builder.addCapability(spv::CapabilityDemoteToHelperInvocation);
              builder.createNoResultOp(spv::OpDemoteToHelperInvocationEXT);
            } else {
                builder.makeStatementTerminator(spv::OpTerminateInvocation, "post-terminate-invocation");
            }
        } else {
            builder.makeStatementTerminator(spv::OpKill, "post-discard");
        }
        break;
    case glslang::EOpTerminateInvocation:
        builder.addExtension(spv::E_SPV_KHR_terminate_invocation);
        builder.makeStatementTerminator(spv::OpTerminateInvocation, "post-terminate-invocation");
        break;
    case glslang::EOpBreak:
        if (breakForLoop.top())
            builder.createLoopExit();
        else
            builder.addSwitchBreak(false);
        break;
    case glslang::EOpContinue:
        builder.createLoopContinue();
        break;
    case glslang::EOpReturn:
        if (node->getExpression() != nullptr) {
            const glslang::TType& glslangReturnType = node->getExpression()->getType();
            spv::Id returnId = accessChainLoad(glslangReturnType);
            if (builder.getTypeId(returnId) != currentFunction->getReturnType() ||
                TranslatePrecisionDecoration(glslangReturnType) != currentFunction->getReturnPrecision()) {
                builder.clearAccessChain();
                spv::Id copyId = builder.createVariable(currentFunction->getReturnPrecision(),
                    spv::StorageClassFunction, currentFunction->getReturnType());
                builder.setAccessChainLValue(copyId);
                multiTypeStore(glslangReturnType, returnId);
                returnId = builder.createLoad(copyId, currentFunction->getReturnPrecision());
            }
            builder.makeReturn(false, returnId);
        } else
            builder.makeReturn(false);

        builder.clearAccessChain();
        break;

    case glslang::EOpDemote:
        builder.createNoResultOp(spv::OpDemoteToHelperInvocationEXT);
        builder.addExtension(spv::E_SPV_EXT_demote_to_helper_invocation);
        builder.addCapability(spv::CapabilityDemoteToHelperInvocationEXT);
        break;
    case glslang::EOpTerminateRayKHR:
        builder.makeStatementTerminator(spv::OpTerminateRayKHR, "post-terminateRayKHR");
        break;
    case glslang::EOpIgnoreIntersectionKHR:
        builder.makeStatementTerminator(spv::OpIgnoreIntersectionKHR, "post-ignoreIntersectionKHR");
        break;

    default:
        assert(0);
        break;
    }

    return false;
}